

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode SUNDataNode_HasChildren_InMem(SUNDataNode self,int *yes_or_no)

{
  int64_t iVar1;
  uint *in_RSI;
  long in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  undefined1 local_19;
  
  if (*(long *)(*(long *)(in_RDI + 0x10) + 0x30) != 0) {
    iVar1 = SUNStlVector_SUNDataNode_Size
                      (*(SUNStlVector_SUNDataNode *)(*(long *)(in_RDI + 0x10) + 0x30));
    local_19 = true;
    if (iVar1 != 0) goto LAB_00107eb2;
  }
  local_19 = *(long *)(*(long *)(in_RDI + 0x10) + 0x28) != 0;
LAB_00107eb2:
  *in_RSI = (uint)local_19;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_HasChildren_InMem(const SUNDataNode self,
                                         sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  *yes_or_no =
    (IMPL_MEMBER(self, anon_children) &&
     SUNStlVector_SUNDataNode_Size(IMPL_MEMBER(self, anon_children)) != 0) ||
    IMPL_MEMBER(self, num_named_children) != 0;
  return SUN_SUCCESS;
}